

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  long lVar1;
  bool bVar2;
  uint flags_00;
  int iVar3;
  ImU32 IVar4;
  char *pcVar5;
  ImGuiPayload *pIVar6;
  ImGuiPayload *pIVar7;
  ulong uVar8;
  char *p;
  undefined1 *p_data;
  ImVec4 *buf_00;
  ImGuiWindow *pIVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint flags_01;
  uint uVar13;
  undefined8 *puVar15;
  char **ppcVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  uint uVar19;
  uint uVar22;
  ImVec2 IVar20;
  uint uVar23;
  undefined1 auVar21 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  char buf [64];
  undefined1 local_148 [4];
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  ImGuiWindow *local_138;
  float local_130;
  float local_12c;
  ulong local_128;
  ImVec2 local_120;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  char *local_f0;
  uint local_e4;
  uint local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  ImGuiWindow *local_c8;
  ImGuiContext *local_c0;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  char *local_a0;
  float *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ImVec4 local_78 [4];
  ImVec2 local_38;
  uint uVar14;
  
  pIVar17 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  pIVar9->WriteAccessed = true;
  if (pIVar9->SkipItems == false) {
    local_118 = GetFrameHeight();
    local_114 = CalcItemWidth();
    local_d8 = ZEXT416(0);
    if ((flags & 0x10U) == 0) {
      local_d8 = ZEXT416((uint)((pIVar17->Style).ItemInnerSpacing.x + local_118));
    }
    pcVar5 = FindRenderedTextEnd(label,(char *)0x0);
    (pIVar17->NextItemData).Flags = 0;
    BeginGroup();
    PushID(label);
    flags_01 = flags & 0xff8ffff7U | 0x100008;
    if ((flags & 0x20U) == 0) {
      flags_01 = flags;
    }
    local_e4 = flags;
    if ((flags_01 & 8) == 0) {
      ColorEditOptionsPopup(col,flags_01);
    }
    if ((flags_01 & 0x700000) == 0) {
      flags_01 = flags_01 | pIVar17->ColorEditOptions & 0x700000U;
    }
    if ((flags_01 & 0x1800000) == 0) {
      flags_01 = flags_01 | pIVar17->ColorEditOptions & 0x1800000U;
    }
    if ((flags_01 & 0x6000000) == 0) {
      flags_01 = flags_01 | pIVar17->ColorEditOptions & 0x6000000U;
    }
    if ((flags_01 & 0x18000000) == 0) {
      flags_01 = flags_01 | pIVar17->ColorEditOptions & 0x18000000U;
    }
    flags_00 = pIVar17->ColorEditOptions & 0xe00fffffU | flags_01;
    if ((flags_00 & 2) == 0) {
      fStack_13c = col[3];
    }
    else {
      fStack_13c = 1.0;
    }
    _local_148 = *(undefined1 (*) [12])col;
    local_e0 = flags_01 & 0x10100000;
    fVar25 = (float)*(undefined8 *)col;
    fVar24 = (float)((ulong)*(undefined8 *)col >> 0x20);
    local_f0 = pcVar5;
    local_c8 = pIVar9;
    if (local_e0 == 0x10100000) {
      ColorConvertHSVtoRGB
                (fVar25,fVar24,col[2],(float *)local_148,(float *)(local_148 + 4),
                 (float *)(local_148 + 8));
    }
    else if ((~flags_01 & 0x8200000) == 0) {
      ColorConvertRGBtoHSV
                (fVar25,fVar24,col[2],(float *)local_148,(float *)(local_148 + 4),
                 (float *)(local_148 + 8));
      ColorEditRestoreHS(col,(float *)local_148,(float *)(local_148 + 4),(float *)(local_148 + 8));
    }
    pIVar9 = local_c8;
    uVar19 = (uint)((float)local_148 * 255.0 +
                   (float)(-(uint)(0.0 <= (float)local_148) & 0x3f000000 |
                          ~-(uint)(0.0 <= (float)local_148) & 0xbf000000));
    uVar22 = (uint)(fStack_144 * 255.0 +
                   (float)(-(uint)(0.0 <= fStack_144) & 0x3f000000 |
                          ~-(uint)(0.0 <= fStack_144) & 0xbf000000));
    uVar23 = (uint)(fStack_140 * 255.0 +
                   (float)(-(uint)(0.0 <= fStack_140) & 0x3f000000 |
                          ~-(uint)(0.0 <= fStack_140) & 0xbf000000));
    local_108 = CONCAT44(uVar22,uVar19);
    uStack_100 = CONCAT44((int)(fStack_13c * 255.0 +
                               (float)(-(uint)(0.0 <= fStack_13c) & 0x3f000000 |
                                      ~-(uint)(0.0 <= fStack_13c) & 0xbf000000)),uVar23);
    local_b8 = (local_c8->DC).CursorPos;
    uStack_b0 = 0;
    fVar25 = (float)local_d8._0_4_;
    if ((pIVar17->Style).ColorButtonPosition != 0) {
      fVar25 = 0.0;
    }
    local_130 = local_114 - (float)local_d8._0_4_;
    uVar14 = (uint)((flags_00 & 2) == 0);
    uVar13 = uVar14 + 3;
    local_90 = (ulong)uVar13;
    (local_c8->DC).CursorPos.x = fVar25 + local_b8.x;
    if (((flags_01 & 0x300000) == 0) || ((flags_00 & 0x20) != 0)) {
      local_128 = 0;
      if ((flags_01 >> 0x16 & 1) == 0) {
        bVar18 = false;
      }
      else {
        bVar18 = false;
        if ((flags_00 & 0x20) == 0) {
          if (0xfe < (int)uVar19) {
            uVar19 = 0xff;
          }
          uVar8 = 0;
          uVar10 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar10 = uVar8;
          }
          if (0xfe < (int)uVar22) {
            uVar22 = 0xff;
          }
          uVar11 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar11 = uVar8;
          }
          if (0xfe < (int)uVar23) {
            uVar23 = 0xff;
          }
          uVar12 = (ulong)uVar23;
          if ((int)uVar23 < 1) {
            uVar12 = uVar8;
          }
          if ((flags_00 & 2) == 0) {
            pcVar5 = "#%02X%02X%02X%02X";
          }
          else {
            pcVar5 = "#%02X%02X%02X";
          }
          ImFormatString((char *)local_78,0x40,pcVar5,uVar10,uVar11,uVar12);
          SetNextItemWidth(local_130);
          local_120.x = 0.0;
          local_120.y = 0.0;
          bVar18 = false;
          buf_00 = local_78;
          bVar2 = InputTextEx("##Text",(char *)0x0,(char *)buf_00,0x40,&local_120,6,
                              (ImGuiInputTextCallback)0x0,(void *)0x0);
          if (bVar2) {
            while (((ulong)*(byte *)&buf_00->x < 0x24 &&
                   ((0x900000200U >> ((ulong)*(byte *)&buf_00->x & 0x3f) & 1) != 0))) {
              buf_00 = (ImVec4 *)((long)&buf_00->x + 1);
            }
            local_108 = 0;
            uStack_100 = 0xff00000000;
            if ((flags_00 & 2) == 0) {
              __isoc99_sscanf(buf_00,"%02X%02X%02X%02X",&local_108,(long)&local_108 + 4,&uStack_100,
                              (long)&uStack_100 + 4);
            }
            else {
              __isoc99_sscanf(buf_00,"%02X%02X%02X",&local_108,(long)&local_108 + 4,&uStack_100,
                              (long)&uStack_100 + 4);
            }
            bVar18 = true;
          }
          if ((flags_00 & 8) == 0) {
            OpenPopupOnItemClick("context",1);
          }
          local_128 = 0;
        }
      }
    }
    else {
      local_c0 = pIVar17;
      fVar25 = (pIVar17->Style).ItemInnerSpacing.x;
      pcVar5 = "M:0.000";
      if ((flags_01 >> 0x18 & 1) == 0) {
        pcVar5 = "M:000";
      }
      local_a0 = label;
      local_98 = col;
      IVar20 = CalcTextSize(pcVar5,(char *)0x0,false,-1.0);
      local_138 = (ImGuiWindow *)CONCAT44(local_138._4_4_,flags_01);
      iVar3 = ((flags_01 >> 0x15 & 1) != 0) + 1;
      bVar18 = (flags_00 >> 0x13 & 1) != 0;
      fVar24 = (float)(uVar14 + 2);
      fVar26 = (float)(int)((local_130 - fVar25 * fVar24) / (float)uVar13);
      local_10c = 1.0;
      if (1.0 <= fVar26) {
        local_10c = fVar26;
      }
      fVar25 = (float)(int)(local_130 - (fVar25 + local_10c) * fVar24);
      local_110 = 1.0;
      if (bVar18) {
        local_110 = 0.0;
      }
      local_dc = 3.57331e-43;
      if (bVar18) {
        local_dc = 0.0;
      }
      local_12c = 1.0;
      if (1.0 <= fVar25) {
        local_12c = fVar25;
      }
      if (local_10c <= IVar20.x) {
        iVar3 = 0;
      }
      local_80 = (long)ColorEdit4::fmt_table_int[0] + (ulong)(uint)(iVar3 << 5);
      local_88 = (long)ColorEdit4::fmt_table_float[0] + (ulong)(uint)(iVar3 << 5);
      uVar10 = 1;
      puVar15 = &local_108;
      ppcVar16 = ColorEdit4::ids;
      p_data = local_148;
      bVar18 = false;
      local_128 = 0;
      do {
        if (uVar10 != 1) {
          SameLine(0.0,(local_c0->Style).ItemInnerSpacing.x);
        }
        fVar25 = local_10c;
        if (uVar13 <= uVar10) {
          fVar25 = local_12c;
        }
        SetNextItemWidth(fVar25);
        if (((uint)local_138 >> 0x18 & 1) == 0) {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_120.x = local_dc;
          bVar2 = DragScalar(*ppcVar16,4,puVar15,1.0,local_78,&local_120,
                             *(char **)(local_80 + -8 + uVar10 * 8),0);
          bVar18 = (bool)(bVar18 | bVar2);
        }
        else {
          local_78[0]._0_8_ = (ulong)(uint)local_78[0].y << 0x20;
          local_120.x = local_110;
          bVar2 = DragScalar(*ppcVar16,8,p_data,0.003921569,local_78,&local_120,
                             *(char **)(local_88 + -8 + uVar10 * 8),0);
          bVar18 = (bool)(bVar18 | bVar2);
          local_128 = CONCAT71((int7)(local_128 >> 8),(byte)local_128 | bVar18);
        }
        if ((flags_00 & 8) == 0) {
          OpenPopupOnItemClick("context",1);
        }
        puVar15 = (undefined8 *)((long)puVar15 + 4);
        ppcVar16 = ppcVar16 + 1;
        p_data = p_data + 4;
        lVar1 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while (lVar1 - (ulong)uVar13 != 1);
      label = local_a0;
      pIVar9 = local_c8;
      col = local_98;
      pIVar17 = local_c0;
      flags_01 = (uint)local_138;
    }
    if ((flags_00 & 0x10) == 0) {
      fVar25 = 0.0;
      if (((flags_00 & 0x20) == 0) && ((pIVar17->Style).ColorButtonPosition != 0)) {
        fVar25 = local_130 + (pIVar17->Style).ItemInnerSpacing.x;
      }
      (pIVar9->DC).CursorPos.x = fVar25 + local_b8.x;
      (pIVar9->DC).CursorPos.y = local_b8.y;
      local_78[0]._0_8_ = *(undefined8 *)col;
      local_78[0].z = col[2];
      if ((flags_00 & 2) == 0) {
        local_78[0].w = col[3];
      }
      else {
        local_78[0].w = 1.0;
      }
      bVar2 = ColorButton("##ColorButton",local_78,flags_00,(ImVec2)0x0);
      if (((flags_00 & 4) == 0) && (bVar2)) {
        (pIVar17->ColorPickerRef).x = local_78[0].x;
        (pIVar17->ColorPickerRef).y = local_78[0].y;
        (pIVar17->ColorPickerRef).z = local_78[0].z;
        (pIVar17->ColorPickerRef).w = local_78[0].w;
        OpenPopup("picker",0);
        local_120.y = (pIVar17->Style).ItemSpacing.y + (pIVar17->LastItemData).Rect.Max.y;
        local_120.x = (pIVar17->LastItemData).Rect.Min.x + 0.0;
        local_38.x = 0.0;
        local_38.y = 0.0;
        SetNextWindowPos(&local_120,0,&local_38);
      }
      if ((flags_00 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_138 = (ImGuiWindow *)0x0;
      bVar2 = BeginPopup("picker",0);
      if (bVar2) {
        local_138 = pIVar17->CurrentWindow;
        if (local_f0 != label) {
          TextEx(label,local_f0,0);
          Spacing();
        }
        uVar19 = local_e4 & 0x1f890002;
        SetNextItemWidth(local_118 * 12.0);
        bVar2 = ColorPicker4("##picker",col,uVar19 | 0x740080,&(pIVar17->ColorPickerRef).x);
        bVar18 = (bool)(bVar18 | bVar2);
        EndPopup();
      }
    }
    else {
      local_138 = (ImGuiWindow *)0x0;
    }
    if ((local_f0 != label) && ((flags_00 & 0x80) == 0)) {
      if ((flags_00 & 0x20) == 0) {
        local_d8 = ZEXT416((uint)(local_114 + (pIVar17->Style).ItemInnerSpacing.x));
      }
      IVar20.x = local_b8.x + (float)local_d8._0_4_;
      IVar20.y = local_b8.y + (pIVar17->Style).FramePadding.y;
      (pIVar9->DC).CursorPos = IVar20;
      TextEx(label,local_f0,0);
    }
    pIVar9 = local_138;
    if ((bVar18 != false) && (local_138 == (ImGuiWindow *)0x0)) {
      if ((local_128 & 1) == 0) {
        auVar21._0_4_ = (float)(int)local_108;
        auVar21._4_4_ = (float)local_108._4_4_;
        auVar21._8_4_ = (float)(int)uStack_100;
        auVar21._12_4_ = (float)uStack_100._4_4_;
        _local_148 = divps(auVar21,_DAT_00190c80);
      }
      auVar21 = _local_148;
      if ((~flags_01 & 0x8200000) == 0) {
        pIVar17->ColorEditLastHue = (float)local_148;
        pIVar17->ColorEditLastSat = fStack_144;
        fStack_140 = auVar21._8_4_;
        fVar25 = fStack_140;
        _local_148 = auVar21;
        ColorConvertHSVtoRGB
                  (auVar21._0_4_,auVar21._4_4_,fVar25,(float *)local_148,(float *)(local_148 + 4),
                   (float *)(local_148 + 8));
        pIVar9 = local_138;
        auVar21 = _local_148;
        local_78[0].x = (float)local_148;
        local_78[0].y = fStack_144;
        local_78[0].z = fStack_140;
        local_78[0].w = 0.0;
        _local_148 = auVar21;
        IVar4 = ColorConvertFloat4ToU32(local_78);
        pIVar17->ColorEditLastColor = IVar4;
      }
      if (local_e0 == 0x10100000) {
        ColorConvertRGBtoHSV
                  ((float)local_148,fStack_144,fStack_140,(float *)local_148,
                   (float *)(local_148 + 4),(float *)(local_148 + 8));
      }
      *(long *)col = _local_148;
      col[2] = fStack_140;
      if ((flags_00 & 2) == 0) {
        col[3] = fStack_13c;
      }
    }
    PopID();
    EndGroup();
    if ((((flags_00 >> 9 & 1) == 0) && (((pIVar17->LastItemData).StatusFlags & 1U) != 0)) &&
       (bVar2 = BeginDragDropTarget(), bVar2)) {
      pIVar6 = AcceptDragDropPayload("_COL3F",0);
      if (pIVar6 != (ImGuiPayload *)0x0) {
        puVar15 = (undefined8 *)pIVar6->Data;
        col[2] = *(float *)(puVar15 + 1);
        *(undefined8 *)col = *puVar15;
        bVar18 = true;
      }
      pIVar7 = AcceptDragDropPayload("_COL4F",0);
      if (pIVar7 != (ImGuiPayload *)0x0) {
        memcpy(col,pIVar7->Data,(ulong)(uint)((int)local_90 << 2));
        bVar18 = true;
      }
      if ((pIVar7 != (ImGuiPayload *)0x0 || pIVar6 != (ImGuiPayload *)0x0) &&
          (flags_01 >> 0x1c & 1) != 0) {
        ColorConvertRGBtoHSV(*col,col[1],col[2],col,col + 1,col + 2);
      }
      EndDragDropTarget();
      pIVar9 = local_138;
    }
    if (((pIVar9 != (ImGuiWindow *)0x0) && (pIVar17->ActiveId != 0)) &&
       (pIVar17->ActiveIdWindow == pIVar9)) {
      (pIVar17->LastItemData).ID = pIVar17->ActiveId;
    }
    if (bVar18 != false) {
      MarkItemEdited((pIVar17->LastItemData).ID);
    }
  }
  else {
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}